

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualSlackViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  cpp_dec_float<50U,_int,_void> *v;
  Item *pIVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  viol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  slacks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_b0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_90;
  cpp_dec_float<50U,_int,_void> *local_78;
  long local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)maxviol,0.0);
  local_78 = &sumviol->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)sumviol,0.0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_90,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_a8,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x60])(this,&local_90);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x61])(this,&local_a8);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar5 = 0;
    local_b0 = this;
    do {
      pIVar7 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar5].idx;
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68.data._M_elems[9]._1_3_ = 0;
      local_68.exp = 0;
      local_68.neg = false;
      local_70 = lVar5;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
      if (0 < (pIVar7->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar8 = 0;
        lVar5 = 0;
        do {
          pNVar2 = (pIVar7->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)
                   ((long)(pNVar2->val).m_backend.data._M_elems + lVar8);
          pcVar6 = &local_90.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&pNVar2->val + 1) + lVar8)].m_backend;
          local_128.fpclass = cpp_dec_float_finite;
          local_128.prec_elem = 10;
          local_128.data._M_elems[0] = 0;
          local_128.data._M_elems[1] = 0;
          local_128.data._M_elems[2] = 0;
          local_128.data._M_elems[3] = 0;
          local_128.data._M_elems[4] = 0;
          local_128.data._M_elems[5] = 0;
          local_128.data._M_elems._24_5_ = 0;
          local_128.data._M_elems[7]._1_3_ = 0;
          local_128.data._M_elems._32_5_ = 0;
          local_128.data._M_elems[9]._1_3_ = 0;
          local_128.exp = 0;
          local_128.neg = false;
          v = pcVar1;
          if ((&local_128 != pcVar6) && (v = pcVar6, pcVar1 != &local_128)) {
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_128.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_128.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_128.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_128.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_128.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_128.exp = *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar8);
            local_128.neg = *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar8 + 4);
            local_128._48_8_ =
                 *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar8 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_128,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_68,&local_128);
          lVar5 = lVar5 + 1;
          lVar8 = lVar8 + 0x3c;
        } while (lVar5 < (pIVar7->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused);
      }
      lVar5 = local_70;
      local_e8.fpclass = cpp_dec_float_finite;
      local_e8.prec_elem = 10;
      local_e8.data._M_elems[0] = 0;
      local_e8.data._M_elems[1] = 0;
      local_e8.data._M_elems[2] = 0;
      local_e8.data._M_elems[3] = 0;
      local_e8.data._M_elems[4] = 0;
      local_e8.data._M_elems[5] = 0;
      local_e8.data._M_elems._24_5_ = 0;
      local_e8.data._M_elems[7]._1_3_ = 0;
      local_e8.data._M_elems._32_5_ = 0;
      local_e8.data._M_elems[9]._1_3_ = 0;
      local_e8.exp = 0;
      local_e8.neg = false;
      if (&local_e8 ==
          &local_a8.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_70].m_backend) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_e8,&local_68);
        if (local_e8.data._M_elems[0] == 0 && local_e8.fpclass == cpp_dec_float_finite) {
          local_128.fpclass = cpp_dec_float_finite;
        }
        else {
          local_e8.neg = (bool)(local_e8.neg ^ 1);
          local_128.fpclass = local_e8.fpclass;
        }
      }
      else {
        local_e8.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
        local_e8.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
        local_e8.data._M_elems[4] = local_68.data._M_elems[4];
        local_e8.data._M_elems[5] = local_68.data._M_elems[5];
        local_e8.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
        local_e8.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
        local_e8.data._M_elems[0] = local_68.data._M_elems[0];
        local_e8.data._M_elems[1] = local_68.data._M_elems[1];
        local_e8.data._M_elems[2] = local_68.data._M_elems[2];
        local_e8.data._M_elems[3] = local_68.data._M_elems[3];
        local_e8.exp = local_68.exp;
        local_e8.neg = local_68.neg;
        local_e8.fpclass = local_68.fpclass;
        local_e8.prec_elem = local_68.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_e8,
                   &local_a8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_70].m_backend);
        local_128.fpclass = local_e8.fpclass;
      }
      this = local_b0;
      local_128.data._M_elems._32_5_ = local_e8.data._M_elems._32_5_;
      local_128.data._M_elems[9]._1_3_ = local_e8.data._M_elems[9]._1_3_;
      local_128.data._M_elems[4] = local_e8.data._M_elems[4];
      local_128.data._M_elems[5] = local_e8.data._M_elems[5];
      local_128.data._M_elems._24_5_ = local_e8.data._M_elems._24_5_;
      local_128.data._M_elems[7]._1_3_ = local_e8.data._M_elems[7]._1_3_;
      local_128.data._M_elems[0] = local_e8.data._M_elems[0];
      local_128.data._M_elems[1] = local_e8.data._M_elems[1];
      uVar3 = local_128.data._M_elems._0_8_;
      local_128.data._M_elems[2] = local_e8.data._M_elems[2];
      local_128.data._M_elems[3] = local_e8.data._M_elems[3];
      local_128.exp = local_e8.exp;
      local_128.prec_elem = local_e8.prec_elem;
      local_128.neg = local_e8.neg;
      if (((local_e8.neg & 1U) != 0) &&
         (local_128.data._M_elems[0] = local_e8.data._M_elems[0],
         local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite)) {
        local_128.neg = (bool)(local_e8.neg ^ 1);
      }
      local_128.data._M_elems._0_8_ = uVar3;
      if (((local_128.fpclass != cpp_dec_float_NaN) &&
          ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_128,&maxviol->m_backend), 0 < iVar4)) {
        *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
             CONCAT35(local_128.data._M_elems[9]._1_3_,local_128.data._M_elems._32_5_);
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_128.data._M_elems._16_8_;
        *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
             CONCAT35(local_128.data._M_elems[7]._1_3_,local_128.data._M_elems._24_5_);
        *(undefined8 *)(maxviol->m_backend).data._M_elems = local_128.data._M_elems._0_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_128.data._M_elems._8_8_;
        (maxviol->m_backend).exp = local_128.exp;
        (maxviol->m_backend).neg = local_128.neg;
        (maxviol->m_backend).fpclass = local_128.fpclass;
        (maxviol->m_backend).prec_elem = local_128.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (local_78,&local_128);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  }
  if (local_a8.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::qualSlackViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());
   VectorBase<R> slacks(this->nRows());

   getPrimalSol(solu);
   getSlacks(slacks);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = spxAbs(val - slacks[row]);

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}